

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::LogParser::LogParser(LogParser *this,cmCTestBZR *bzr,char *prefix)

{
  char *prefix_local;
  cmCTestBZR *bzr_local;
  LogParser *this_local;
  
  cmProcessTools::OutputLogger::OutputLogger
            (&this->super_OutputLogger,(bzr->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_00c3f8b0;
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__LogParser_00c3f908;
  this->BZR = bzr;
  cmCTestVC::Revision::Revision(&this->Rev);
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::vector
            (&this->Changes);
  cmCTestGlobalVC::Change::Change(&this->CurChange,'?');
  std::vector<char,_std::allocator<char>_>::vector(&this->CData);
  cmsys::RegularExpression::RegularExpression
            (&this->EmailRegex,"(.*) <([A-Za-z0-9._%+-]+@[A-Za-z0-9.-]+)>");
  (*(this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser[4])();
  return;
}

Assistant:

LogParser(cmCTestBZR* bzr, const char* prefix):
    OutputLogger(bzr->Log, prefix), BZR(bzr),
    EmailRegex("(.*) <([A-Za-z0-9._%+-]+@[A-Za-z0-9.-]+)>")
    { this->InitializeParser(); }